

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::IsnanCaseInstance::compare
          (IsnanCaseInstance *this,void **inputs,void **outputs)

{
  uint uVar1;
  pointer pSVar2;
  uint uVar3;
  ostream *poVar4;
  ostringstream *poVar5;
  bool bVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  uVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (uVar1 == 2) {
    if (0 < (int)uVar3) {
      uVar8 = 0;
      do {
        uVar1 = *(uint *)((long)*inputs + uVar8 * 4);
        bVar10 = (~uVar1 & 0x7f800000) == 0;
        bVar11 = (uVar1 & 0x7fffff) != 0;
        bVar6 = bVar11 && bVar10;
        if ((*(int *)((long)*outputs + uVar8 * 4) == 0) == bVar6) {
          poVar5 = &(this->super_CommonFunctionTestInstance).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Expected [",10);
          poVar4 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
          pcVar7 = "false";
          if (bVar11 && bVar10) {
            pcVar7 = "true";
          }
          uVar8 = (ulong)bVar6 ^ 5;
LAB_00861606:
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,uVar8);
          return false;
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != uVar8);
    }
  }
  else if (0 < (int)uVar3 && uVar1 < 2) {
    lVar9 = 0;
    do {
      uVar1 = *(uint *)((long)*inputs + lVar9 * 4);
      if (((~uVar1 & 0x7f800000) != 0 || (uVar1 & 0x7fffff) == 0) &&
         (*(int *)((long)*outputs + lVar9 * 4) != 0)) {
        poVar5 = &(this->super_CommonFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Expected [",10);
        poVar4 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
        pcVar7 = "false";
        uVar8 = 5;
        goto LAB_00861606;
      }
      lVar9 = lVar9 + 1;
    } while (uVar3 != (uint)lVar9);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP)
		{
			// Only highp is required to support inf/nan
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float32(in0).isNaN();

				if (out0 != ref)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << (ref ? "true" : "false");
					return false;
				}
			}
		}
		else if (precision == glu::PRECISION_MEDIUMP || precision == glu::PRECISION_LOWP)
		{
			// NaN support is optional, check that inputs that are not NaN don't result in true.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const bool		out0	= ((const deUint32*)outputs[0])[compNdx] != 0;
				const bool		ref		= tcu::Float32(in0).isNaN();

				if (!ref && out0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << (ref ? "true" : "false");
					return false;
				}
			}
		}

		return true;
	}